

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_max_a_h_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t *pfVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  
  pfVar1 = (env->active_fpu).fpr + ws;
  uVar18 = *(ushort *)pfVar1;
  uVar19 = *(ushort *)((long)pfVar1 + 2);
  uVar20 = *(ushort *)((long)pfVar1 + 4);
  uVar21 = *(ushort *)((long)pfVar1 + 6);
  uVar22 = *(ushort *)((long)pfVar1 + 8);
  uVar23 = *(ushort *)((long)pfVar1 + 10);
  uVar24 = *(ushort *)((long)pfVar1 + 0xc);
  uVar25 = *(ushort *)((long)pfVar1 + 0xe);
  pfVar1 = (env->active_fpu).fpr + wt;
  uVar26 = *(ushort *)pfVar1;
  uVar27 = *(ushort *)((long)pfVar1 + 2);
  uVar28 = *(ushort *)((long)pfVar1 + 4);
  uVar29 = *(ushort *)((long)pfVar1 + 6);
  uVar30 = *(ushort *)((long)pfVar1 + 8);
  uVar31 = *(ushort *)((long)pfVar1 + 10);
  uVar32 = *(ushort *)((long)pfVar1 + 0xc);
  uVar33 = *(ushort *)((long)pfVar1 + 0xe);
  sVar2 = -uVar18;
  sVar3 = -uVar19;
  sVar4 = -uVar20;
  sVar5 = -uVar21;
  sVar6 = -uVar22;
  sVar7 = -uVar23;
  sVar8 = -uVar24;
  sVar9 = -uVar25;
  sVar10 = -uVar26;
  sVar11 = -uVar27;
  sVar12 = -uVar28;
  sVar13 = -uVar29;
  sVar14 = -uVar30;
  sVar15 = -uVar31;
  sVar16 = -uVar32;
  sVar17 = -uVar33;
  uVar34 = -(ushort)((short)(((sVar10 < (short)uVar26) * uVar26 |
                             (ushort)(sVar10 >= (short)uVar26) * sVar10) ^ 0x8000) <
                    (short)(((sVar2 < (short)uVar18) * uVar18 |
                            (ushort)(sVar2 >= (short)uVar18) * sVar2) ^ 0x8000));
  uVar35 = -(ushort)((short)(((sVar11 < (short)uVar27) * uVar27 |
                             (ushort)(sVar11 >= (short)uVar27) * sVar11) ^ 0x8000) <
                    (short)(((sVar3 < (short)uVar19) * uVar19 |
                            (ushort)(sVar3 >= (short)uVar19) * sVar3) ^ 0x8000));
  uVar36 = -(ushort)((short)(((sVar12 < (short)uVar28) * uVar28 |
                             (ushort)(sVar12 >= (short)uVar28) * sVar12) ^ 0x8000) <
                    (short)(((sVar4 < (short)uVar20) * uVar20 |
                            (ushort)(sVar4 >= (short)uVar20) * sVar4) ^ 0x8000));
  uVar37 = -(ushort)((short)(((sVar13 < (short)uVar29) * uVar29 |
                             (ushort)(sVar13 >= (short)uVar29) * sVar13) ^ 0x8000) <
                    (short)(((sVar5 < (short)uVar21) * uVar21 |
                            (ushort)(sVar5 >= (short)uVar21) * sVar5) ^ 0x8000));
  uVar38 = -(ushort)((short)(((sVar14 < (short)uVar30) * uVar30 |
                             (ushort)(sVar14 >= (short)uVar30) * sVar14) ^ 0x8000) <
                    (short)(((sVar6 < (short)uVar22) * uVar22 |
                            (ushort)(sVar6 >= (short)uVar22) * sVar6) ^ 0x8000));
  uVar39 = -(ushort)((short)(((sVar15 < (short)uVar31) * uVar31 |
                             (ushort)(sVar15 >= (short)uVar31) * sVar15) ^ 0x8000) <
                    (short)(((sVar7 < (short)uVar23) * uVar23 |
                            (ushort)(sVar7 >= (short)uVar23) * sVar7) ^ 0x8000));
  uVar40 = -(ushort)((short)(((sVar16 < (short)uVar32) * uVar32 |
                             (ushort)(sVar16 >= (short)uVar32) * sVar16) ^ 0x8000) <
                    (short)(((sVar8 < (short)uVar24) * uVar24 |
                            (ushort)(sVar8 >= (short)uVar24) * sVar8) ^ 0x8000));
  uVar41 = -(ushort)((short)(((sVar17 < (short)uVar33) * uVar33 |
                             (ushort)(sVar17 >= (short)uVar33) * sVar17) ^ 0x8000) <
                    (short)(((sVar9 < (short)uVar25) * uVar25 |
                            (ushort)(sVar9 >= (short)uVar25) * sVar9) ^ 0x8000));
  pfVar1 = (env->active_fpu).fpr + wd;
  *(ushort *)pfVar1 = ~uVar34 & uVar26 | uVar18 & uVar34;
  *(ushort *)((long)pfVar1 + 2) = ~uVar35 & uVar27 | uVar19 & uVar35;
  *(ushort *)((long)pfVar1 + 4) = ~uVar36 & uVar28 | uVar20 & uVar36;
  *(ushort *)((long)pfVar1 + 6) = ~uVar37 & uVar29 | uVar21 & uVar37;
  *(ushort *)((long)pfVar1 + 8) = ~uVar38 & uVar30 | uVar22 & uVar38;
  *(ushort *)((long)pfVar1 + 10) = ~uVar39 & uVar31 | uVar23 & uVar39;
  *(ushort *)((long)pfVar1 + 0xc) = ~uVar40 & uVar32 | uVar24 & uVar40;
  *(ushort *)((long)pfVar1 + 0xe) = ~uVar41 & uVar33 | uVar25 & uVar41;
  return;
}

Assistant:

void helper_msa_max_a_h(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->h[0]  = msa_max_a_df(DF_HALF, pws->h[0],  pwt->h[0]);
    pwd->h[1]  = msa_max_a_df(DF_HALF, pws->h[1],  pwt->h[1]);
    pwd->h[2]  = msa_max_a_df(DF_HALF, pws->h[2],  pwt->h[2]);
    pwd->h[3]  = msa_max_a_df(DF_HALF, pws->h[3],  pwt->h[3]);
    pwd->h[4]  = msa_max_a_df(DF_HALF, pws->h[4],  pwt->h[4]);
    pwd->h[5]  = msa_max_a_df(DF_HALF, pws->h[5],  pwt->h[5]);
    pwd->h[6]  = msa_max_a_df(DF_HALF, pws->h[6],  pwt->h[6]);
    pwd->h[7]  = msa_max_a_df(DF_HALF, pws->h[7],  pwt->h[7]);
}